

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

uint32 __thiscall
Wasm::WasmBytecodeGenerator::WriteTypeStackToString
          (WasmBytecodeGenerator *this,char16 *out,uint32 maxlen)

{
  WasmType type;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  EmitInfo *pEVar4;
  char16 *msg;
  long lVar5;
  int iVar6;
  anon_class_24_3_b7e35369 local_58;
  char16 *local_40;
  char16 *out_local;
  uint32 maxlen_local;
  
  local_40 = out;
  out_local._0_4_ = maxlen;
  if (out == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x37,"(out != nullptr)","out != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_58.numwritten = (uint32 *)((long)&out_local + 4);
  out_local._4_4_ = 0;
  local_58.out = &local_40;
  local_58.maxlen = (uint32 *)&out_local;
  WriteTypeStackToString::anon_class_24_3_b7e35369::operator()(&local_58,L"[");
  iVar6 = -2;
  do {
    pEVar4 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Peek
                       (&this->m_evalStack,iVar6 + 2);
    iVar6 = iVar6 + 1;
  } while (pEVar4->type != Limit);
  bVar2 = true;
  for (; -1 < iVar6; iVar6 = iVar6 + -1) {
    pEVar4 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Peek
                       (&this->m_evalStack,iVar6);
    type = pEVar4->type;
    if (!bVar2) {
      WriteTypeStackToString::anon_class_24_3_b7e35369::operator()(&local_58,L", ");
    }
    msg = WasmTypes::GetTypeName(type);
    WriteTypeStackToString::anon_class_24_3_b7e35369::operator()(&local_58,msg);
    bVar2 = false;
  }
  WriteTypeStackToString::anon_class_24_3_b7e35369::operator()(&local_58,L"]");
  if ((uint32)out_local - 5 <= out_local._4_4_) {
    for (lVar5 = -1; lVar5 != -6; lVar5 = lVar5 + -1) {
      local_40[(ulong)(uint32)out_local + lVar5] = L'\0';
    }
    out_local._4_4_ = out_local._4_4_ - 5;
    iVar6 = _snwprintf_unsafe(local_40 + out_local._4_4_,
                              (ulong)((uint32)out_local - out_local._4_4_),0xffffffffffffffff,
                              L"...]");
    out_local._4_4_ = iVar6 + out_local._4_4_;
  }
  return out_local._4_4_;
}

Assistant:

uint32 WasmBytecodeGenerator::WriteTypeStackToString(_Out_writes_(maxlen) char16* out, uint32 maxlen) const
{
    AssertOrFailFast(out != nullptr);
    uint32 numwritten = 0;
    WriteTypeStack([&] (const char16* msg)
    {
        numwritten += _snwprintf_s(out + numwritten, maxlen - numwritten, _TRUNCATE, msg);
    });
    if (numwritten >= maxlen - 5)
    {
        // null out the last 5 characters so we can properly end it
        for (int i = 1; i <= 5; i++)
        {
            *(out + maxlen - i) = 0;
        }
        numwritten -= 5;
        numwritten += _snwprintf_s(out + numwritten, maxlen - numwritten, _TRUNCATE, _u("...]"));
    }
    return numwritten;
}